

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriMemory.c
# Opt level: O2

int uriTestMemoryManager(UriMemoryManager *memory)

{
  char *pcVar1;
  UriBool UVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  
  if (memory == (UriMemoryManager *)0x0) {
    iVar5 = 2;
  }
  else {
    UVar2 = uriMemoryManagerIsComplete(memory);
    if (UVar2 == 0) {
      iVar5 = 10;
    }
    else {
      pvVar3 = (*memory->malloc)(memory,7);
      iVar5 = 0xb;
      if (pvVar3 != (void *)0x0) {
        *(undefined1 *)((long)pvVar3 + 6) = 0xf1;
        (*memory->free)(memory,pvVar3);
        pvVar3 = (*memory->calloc)(memory,3,5);
        if (pvVar3 != (void *)0x0) {
          lVar4 = 0;
          while (lVar4 != 0xf) {
            pcVar1 = (char *)((long)pvVar3 + lVar4);
            lVar4 = lVar4 + 1;
            if (*pcVar1 != '\0') {
              return 0xb;
            }
          }
          *(undefined1 *)((long)pvVar3 + 0xe) = 0xf2;
          (*memory->free)(memory,pvVar3);
          pvVar3 = (*memory->malloc)(memory,7);
          if (pvVar3 == (void *)0x0) {
            return 0xb;
          }
          for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
            *(undefined1 *)((long)pvVar3 + lVar4) = 0xf3;
          }
          pvVar3 = (*memory->realloc)(memory,pvVar3,0xb);
          if (pvVar3 == (void *)0x0) {
            return 0xb;
          }
          lVar4 = 0;
          while (lVar4 != 7) {
            pcVar1 = (char *)((long)pvVar3 + lVar4);
            lVar4 = lVar4 + 1;
            if (*pcVar1 != -0xd) {
              return 0xb;
            }
          }
          *(undefined1 *)((long)pvVar3 + 10) = 0xf4;
          (*memory->free)(memory,pvVar3);
          pvVar3 = (*memory->malloc)(memory,7);
          if (pvVar3 == (void *)0x0) {
            return 0xb;
          }
          *(undefined1 *)((long)pvVar3 + 6) = 0xf5;
          (*memory->realloc)(memory,pvVar3,0);
          pvVar3 = (*memory->realloc)(memory,(void *)0x0,7);
          if (pvVar3 == (void *)0x0) {
            return 0xb;
          }
          *(undefined1 *)((long)pvVar3 + 6) = 0xf6;
          (*memory->free)(memory,pvVar3);
          pvVar3 = (*memory->realloc)(memory,(void *)0x0,0);
          if (pvVar3 != (void *)0x0) {
            (*memory->free)(memory,pvVar3);
          }
          pvVar3 = (*memory->malloc)(memory,7);
          if (pvVar3 == (void *)0x0) {
            return 0xb;
          }
          for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
            *(undefined1 *)((long)pvVar3 + lVar4) = 0xf7;
          }
          pvVar3 = (*memory->reallocarray)(memory,pvVar3,5,7);
          if (pvVar3 == (void *)0x0) {
            return 0xb;
          }
          lVar4 = 0;
          do {
            if (lVar4 == 7) {
              *(undefined1 *)((long)pvVar3 + 0x22) = 0xf8;
              (*memory->free)(memory,pvVar3);
              pvVar3 = (*memory->malloc)(memory,7);
              if (pvVar3 == (void *)0x0) {
                return 0xb;
              }
              *(undefined1 *)((long)pvVar3 + 6) = 0xf9;
              (*memory->reallocarray)(memory,pvVar3,0,7);
              pvVar3 = (*memory->malloc)(memory,7);
              if (pvVar3 == (void *)0x0) {
                return 0xb;
              }
              *(undefined1 *)((long)pvVar3 + 6) = 0xfa;
              (*memory->reallocarray)(memory,pvVar3,5,0);
              pvVar3 = (*memory->malloc)(memory,7);
              if (pvVar3 == (void *)0x0) {
                return 0xb;
              }
              *(undefined1 *)((long)pvVar3 + 6) = 0xfb;
              (*memory->reallocarray)(memory,pvVar3,0,0);
              pvVar3 = (*memory->reallocarray)(memory,(void *)0x0,3,5);
              if (pvVar3 == (void *)0x0) {
                return 0xb;
              }
              *(undefined1 *)((long)pvVar3 + 0xe) = 0xfc;
              (*memory->free)(memory,pvVar3);
              pvVar3 = (*memory->reallocarray)(memory,(void *)0x0,0,5);
              if (pvVar3 != (void *)0x0) {
                (*memory->free)(memory,pvVar3);
              }
              pvVar3 = (*memory->reallocarray)(memory,(void *)0x0,3,0);
              if (pvVar3 != (void *)0x0) {
                (*memory->free)(memory,pvVar3);
              }
              pvVar3 = (*memory->reallocarray)(memory,(void *)0x0,0,0);
              if (pvVar3 == (void *)0x0) {
                return 0;
              }
              (*memory->free)(memory,pvVar3);
              return 0;
            }
            pcVar1 = (char *)((long)pvVar3 + lVar4);
            lVar4 = lVar4 + 1;
          } while (*pcVar1 == -9);
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int uriTestMemoryManager(UriMemoryManager * memory) {
	const size_t mallocSize = 7;
	const size_t callocNmemb = 3;
	const size_t callocSize = 5;
	const size_t callocTotalSize = callocNmemb * callocSize;
	const size_t reallocSize = 11;
	const size_t reallocarrayNmemb = 5;
	const size_t reallocarraySize = 7;
	const size_t reallocarrayTotal = reallocarrayNmemb * reallocarraySize;
	size_t index;
	char * buffer;

	if (memory == NULL) {
		return URI_ERROR_NULL;
	}

	if (uriMemoryManagerIsComplete(memory) != URI_TRUE) {
		return URI_ERROR_MEMORY_MANAGER_INCOMPLETE;
	}

	/* malloc + free*/
	buffer = memory->malloc(memory, mallocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	buffer[mallocSize - 1] = '\xF1';
	memory->free(memory, buffer);
	buffer = NULL;

	/* calloc + free */
	buffer = memory->calloc(memory, callocNmemb, callocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	for (index = 0; index < callocTotalSize; index++) {  /* all zeros? */
		if (buffer[index] != '\0') {
			return URI_ERROR_MEMORY_MANAGER_FAULTY;
		}
	}
	buffer[callocTotalSize - 1] = '\xF2';
	memory->free(memory, buffer);
	buffer = NULL;

	/* malloc + realloc + free */
	buffer = memory->malloc(memory, mallocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	for (index = 0; index < mallocSize; index++) {
		buffer[index] = '\xF3';
	}
	buffer = memory->realloc(memory, buffer, reallocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	for (index = 0; index < mallocSize; index++) {  /* previous content? */
		if (buffer[index] != '\xF3') {
			return URI_ERROR_MEMORY_MANAGER_FAULTY;
		}
	}
	buffer[reallocSize - 1] = '\xF4';
	memory->free(memory, buffer);
	buffer = NULL;

	/* malloc + realloc ptr!=NULL size==0 (equals free) */
	buffer = memory->malloc(memory, mallocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	buffer[mallocSize - 1] = '\xF5';
	memory->realloc(memory, buffer, 0);
	buffer = NULL;

	/* realloc ptr==NULL size!=0 (equals malloc) + free */
	buffer = memory->realloc(memory, NULL, mallocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	buffer[mallocSize - 1] = '\xF6';
	memory->free(memory, buffer);
	buffer = NULL;

	/* realloc ptr==NULL size==0 (equals malloc) + free */
	buffer = memory->realloc(memory, NULL, 0);
	if (buffer != NULL) {
		memory->free(memory, buffer);
		buffer = NULL;
	}

	/* malloc + reallocarray + free */
	buffer = memory->malloc(memory, mallocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	for (index = 0; index < mallocSize; index++) {
		buffer[index] = '\xF7';
	}
	buffer = memory->reallocarray(memory, buffer, reallocarrayNmemb,
			reallocarraySize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	for (index = 0; index < mallocSize; index++) {  /* previous content? */
		if (buffer[index] != '\xF7') {
			return URI_ERROR_MEMORY_MANAGER_FAULTY;
		}
	}
	buffer[reallocarrayTotal - 1] = '\xF8';
	memory->free(memory, buffer);
	buffer = NULL;

	/* malloc + reallocarray ptr!=NULL nmemb==0 size!=0 (equals free) */
	buffer = memory->malloc(memory, mallocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	buffer[mallocSize - 1] = '\xF9';
	memory->reallocarray(memory, buffer, 0, reallocarraySize);
	buffer = NULL;

	/* malloc + reallocarray ptr!=NULL nmemb!=0 size==0 (equals free) */
	buffer = memory->malloc(memory, mallocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	buffer[mallocSize - 1] = '\xFA';
	memory->reallocarray(memory, buffer, reallocarrayNmemb, 0);
	buffer = NULL;

	/* malloc + reallocarray ptr!=NULL nmemb==0 size==0 (equals free) */
	buffer = memory->malloc(memory, mallocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	buffer[mallocSize - 1] = '\xFB';
	memory->reallocarray(memory, buffer, 0, 0);
	buffer = NULL;

	/* reallocarray ptr==NULL nmemb!=0 size!=0 (equals malloc) + free */
	buffer = memory->reallocarray(memory, NULL, callocNmemb, callocSize);
	if (buffer == NULL) {
		return URI_ERROR_MEMORY_MANAGER_FAULTY;
	}
	buffer[callocTotalSize - 1] = '\xFC';
	memory->free(memory, buffer);
	buffer = NULL;

	/* reallocarray ptr==NULL nmemb==0 size!=0 (equals malloc) + free */
	buffer = memory->reallocarray(memory, NULL, 0, callocSize);
	if (buffer != NULL) {
		memory->free(memory, buffer);
		buffer = NULL;
	}

	/* reallocarray ptr==NULL nmemb!=0 size==0 (equals malloc) + free */
	buffer = memory->reallocarray(memory, NULL, callocNmemb, 0);
	if (buffer != NULL) {
		memory->free(memory, buffer);
		buffer = NULL;
	}

	/* reallocarray ptr==NULL nmemb==0 size==0 (equals malloc) + free */
	buffer = memory->reallocarray(memory, NULL, 0, 0);
	if (buffer != NULL) {
		memory->free(memory, buffer);
		buffer = NULL;
	}

	return URI_SUCCESS;
}